

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::clara::detail::Opt::isMatch(Opt *this,string *optToken)

{
  bool bVar1;
  __type_conflict1 _Var2;
  string local_80;
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string normalisedToken;
  string *optToken_local;
  Opt *this_local;
  
  normalisedToken.field_2._8_8_ = optToken;
  normaliseOpt((string *)&__range3,optToken);
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->m_optNames);
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->m_optNames);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&name);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_00173333:
      ::std::__cxx11::string::~string((string *)&__range3);
      return this_local._7_1_;
    }
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
    normaliseOpt(&local_80,local_60);
    _Var2 = ::std::operator==(&local_80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range3);
    ::std::__cxx11::string::~string((string *)&local_80);
    if (_Var2) {
      this_local._7_1_ = true;
      goto LAB_00173333;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

auto isMatch( std::string const &optToken ) const -> bool {
            auto normalisedToken = normaliseOpt( optToken );
            for( auto const &name : m_optNames ) {
                if( normaliseOpt( name ) == normalisedToken )
                    return true;
            }
            return false;
        }